

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_rightclick(_glist *x,int xpos,int ypos,t_gobj *y)

{
  t_propertiesfn p_Var1;
  t_symbol *s;
  t_gotfn p_Var2;
  uint uVar3;
  ulong uVar4;
  
  if (y == (t_gobj *)0x0) {
    uVar3 = 0;
    uVar4 = 1;
  }
  else {
    p_Var1 = class_getpropertiesfn(y->g_pd);
    uVar4 = (ulong)(p_Var1 != (t_propertiesfn)0x0);
    s = gensym("menu-open");
    p_Var2 = zgetfn(&y->g_pd,s);
    uVar3 = (uint)(p_Var2 != (t_gotfn)0x0);
  }
  pdgui_vmess("pdtk_canvas_popup","^ ii ii",x,xpos,(ulong)(uint)ypos,uVar4,uVar3);
  return;
}

Assistant:

static void canvas_rightclick(t_canvas *x, int xpos, int ypos, t_gobj *y)
{
    int canprop, canopen;
    canprop = (!y || class_getpropertiesfn(pd_class(&y->g_pd)));
    canopen = (y && zgetfn(&y->g_pd, gensym("menu-open")));
    pdgui_vmess("pdtk_canvas_popup", "^ ii ii",
        x,
        xpos, ypos,
        canprop, canopen);
}